

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall
nonius::standard_reporter::print_outliers(standard_reporter *this,outlier_classification o)

{
  int iVar1;
  ostream *poVar2;
  ostream *poVar3;
  char *in_RDI;
  standard_reporter *unaff_retaddr;
  outlier_classification *this_00;
  string local_28 [24];
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  char *description;
  
  this_00 = (outlier_classification *)&stack0x00000008;
  description = in_RDI;
  poVar2 = reporter::report_stream((reporter *)0x1ecc01);
  poVar2 = std::operator<<(poVar2,"found ");
  iVar1 = outlier_classification::total(this_00);
  poVar3 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar3 = std::operator<<(poVar3," outliers among ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this_00->samples_seen);
  poVar3 = std::operator<<(poVar3," samples (");
  outlier_classification::total(this_00);
  nonius::detail::percentage_ratio_abi_cxx11_((double)this_00,(double)poVar2);
  poVar2 = std::operator<<(poVar3,local_28);
  std::operator<<(poVar2,")\n");
  std::__cxx11::string::~string(local_28);
  if ((in_RDI[0x30] & 1U) != 0) {
    print_outlier_count(unaff_retaddr,description,in_stack_fffffffffffffff4,
                        in_stack_fffffffffffffff0);
    print_outlier_count(unaff_retaddr,description,in_stack_fffffffffffffff4,
                        in_stack_fffffffffffffff0);
    print_outlier_count(unaff_retaddr,description,in_stack_fffffffffffffff4,
                        in_stack_fffffffffffffff0);
    print_outlier_count(unaff_retaddr,description,in_stack_fffffffffffffff4,
                        in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void print_outliers(outlier_classification o) {
            report_stream() << "found " << o.total() << " outliers among " << o.samples_seen << " samples (" << detail::percentage_ratio(o.total(), o.samples_seen) << ")\n";
            if(verbose) {
                print_outlier_count("low severe", o.low_severe, o.samples_seen);
                print_outlier_count("low mild", o.low_mild, o.samples_seen);
                print_outlier_count("high mild", o.high_mild, o.samples_seen);
                print_outlier_count("high severe", o.high_severe, o.samples_seen);
            }
        }